

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScene::dragMoveEvent(QGraphicsScene *this,QGraphicsSceneDragDropEvent *event)

{
  long lVar1;
  char cVar2;
  QGraphicsScenePrivate *this_00;
  QGraphicsItem *this_01;
  QGraphicsItem **ppQVar3;
  bool bVar4;
  bool bVar5;
  DropAction DVar6;
  QWidget *widget;
  int iVar7;
  QGraphicsScenePrivate *pQVar8;
  long lVar9;
  long in_FS_OFFSET;
  QPointF QVar10;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 local_78 [16];
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_68;
  QList<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  (event->super_QGraphicsSceneEvent).field_0xc = 0;
  if ((this_00->mouseGrabberItems).d.size != 0) {
    if ((this_00->mouseGrabberItems).d.size != 0) {
      QGraphicsItem::ungrabMouse(*(this_00->mouseGrabberItems).d.ptr);
    }
    this_00->lastMouseGrabberItem = (QGraphicsItem *)0x0;
    QMap<Qt::MouseButton,_QPointF>::clear(&this_00->mouseGrabberButtonDownPos);
    QMap<Qt::MouseButton,_QPointF>::clear(&this_00->mouseGrabberButtonDownScenePos);
    QMap<Qt::MouseButton,_QPoint>::clear(&this_00->mouseGrabberButtonDownScreenPos);
  }
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = QGraphicsSceneDragDropEvent::screenPos(event);
  QVar10 = QGraphicsSceneDragDropEvent::scenePos(event);
  local_78._8_8_ = QVar10.yp;
  local_78._0_8_ = QVar10.xp;
  widget = QGraphicsSceneEvent::widget(&event->super_QGraphicsSceneEvent);
  QGraphicsScenePrivate::itemsAtPosition
            (&local_58,this_00,(QPoint *)local_98,(QPointF *)local_78,widget);
  ppQVar3 = local_58.d.ptr;
  if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
    lVar1 = local_58.d.size * 8;
    bVar5 = false;
    lVar9 = 0;
    do {
      this_01 = *(QGraphicsItem **)((long)ppQVar3 + lVar9);
      bVar4 = QGraphicsItem::isEnabled(this_01);
      iVar7 = 3;
      if (bVar4) {
        bVar4 = QGraphicsItem::acceptDrops(this_01);
        if (bVar4) {
          if (this_01 != this_00->dragDropItem) {
            local_68.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
            local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            pQVar8 = (QGraphicsScenePrivate *)local_78;
            QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
                      ((QGraphicsSceneDragDropEvent *)local_78,GraphicsSceneDragEnter);
            QGraphicsScenePrivate::cloneDragDropEvent
                      (pQVar8,(QGraphicsSceneDragDropEvent *)local_78,event);
            DVar6 = QGraphicsSceneDragDropEvent::proposedAction(event);
            QGraphicsSceneDragDropEvent::setDropAction
                      ((QGraphicsSceneDragDropEvent *)local_78,DVar6);
            QGraphicsScenePrivate::sendDragDropEvent
                      (this_00,this_01,(QGraphicsSceneDragDropEvent *)local_78);
            (**(code **)(*(long *)&event->super_QGraphicsSceneEvent + 0x10))(event,local_78[0xc]);
            DVar6 = QGraphicsSceneDragDropEvent::dropAction((QGraphicsSceneDragDropEvent *)local_78)
            ;
            QGraphicsSceneDragDropEvent::setDropAction(event,DVar6);
            cVar2 = (event->super_QGraphicsSceneEvent).field_0xc;
            iVar7 = 3;
            if (cVar2 == '\x01') {
              DVar6 = QGraphicsSceneDragDropEvent::dropAction(event);
              this_00->lastDropAction = DVar6;
              if (this_00->dragDropItem != (QGraphicsItem *)0x0) {
                local_88 = &DAT_aaaaaaaaaaaaaaaa;
                local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                pQVar8 = (QGraphicsScenePrivate *)local_98;
                QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
                          ((QGraphicsSceneDragDropEvent *)local_98,GraphicsSceneDragLeave);
                QGraphicsScenePrivate::cloneDragDropEvent
                          (pQVar8,(QGraphicsSceneDragDropEvent *)local_98,event);
                QGraphicsScenePrivate::sendDragDropEvent
                          (this_00,this_00->dragDropItem,(QGraphicsSceneDragDropEvent *)local_98);
                QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent
                          ((QGraphicsSceneHelpEvent *)local_98);
              }
              this_00->dragDropItem = this_01;
              iVar7 = 0;
            }
            QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_78);
            if (cVar2 == '\0') goto LAB_00617492;
          }
          QGraphicsSceneDragDropEvent::setDropAction(event,this_00->lastDropAction);
          (event->super_QGraphicsSceneEvent).field_0xc = 1;
          QGraphicsScenePrivate::sendDragDropEvent(this_00,this_01,event);
          bVar5 = true;
          iVar7 = 2;
          if ((event->super_QGraphicsSceneEvent).field_0xc == '\x01') {
            DVar6 = QGraphicsSceneDragDropEvent::dropAction(event);
            this_00->lastDropAction = DVar6;
          }
        }
      }
LAB_00617492:
    } while ((iVar7 == 3) && (bVar4 = lVar1 + -8 != lVar9, lVar9 = lVar9 + 8, bVar4));
    if (bVar5) goto LAB_0061751f;
  }
  if (this_00->dragDropItem != (QGraphicsItem *)0x0) {
    local_68.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar8 = (QGraphicsScenePrivate *)local_78;
    QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
              ((QGraphicsSceneDragDropEvent *)local_78,GraphicsSceneDragLeave);
    QGraphicsScenePrivate::cloneDragDropEvent(pQVar8,(QGraphicsSceneDragDropEvent *)local_78,event);
    QGraphicsScenePrivate::sendDragDropEvent
              (this_00,this_00->dragDropItem,(QGraphicsSceneDragDropEvent *)local_78);
    this_00->dragDropItem = (QGraphicsItem *)0x0;
    QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_78);
  }
  QGraphicsSceneDragDropEvent::setDropAction(event,IgnoreAction);
LAB_0061751f:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::dragMoveEvent(QGraphicsSceneDragDropEvent *event)
{
    Q_D(QGraphicsScene);
    event->ignore();

    if (!d->mouseGrabberItems.isEmpty()) {
        // Mouse grabbers that start drag events lose the mouse grab.
        d->clearMouseGrabber();
        d->mouseGrabberButtonDownPos.clear();
        d->mouseGrabberButtonDownScenePos.clear();
        d->mouseGrabberButtonDownScreenPos.clear();
    }

    bool eventDelivered = false;

    // Find the topmost enabled items under the cursor. They are all
    // candidates for accepting drag & drop events.
    const auto items = d->itemsAtPosition(event->screenPos(),
                                          event->scenePos(),
                                          event->widget());
    for (QGraphicsItem *item : items) {
        if (!item->isEnabled() || !item->acceptDrops())
            continue;

        if (item != d->dragDropItem) {
            // Enter the new drag drop item. If it accepts the event, we send
            // the leave to the parent item.
            QGraphicsSceneDragDropEvent dragEnter(QEvent::GraphicsSceneDragEnter);
            d->cloneDragDropEvent(&dragEnter, event);
            dragEnter.setDropAction(event->proposedAction());
            d->sendDragDropEvent(item, &dragEnter);
            event->setAccepted(dragEnter.isAccepted());
            event->setDropAction(dragEnter.dropAction());
            if (!event->isAccepted()) {
                // Propagate to the item under
                continue;
            }

            d->lastDropAction = event->dropAction();

            if (d->dragDropItem) {
                // Leave the last drag drop item. A perfect implementation
                // would set the position of this event to the point where
                // this event and the last event intersect with the item's
                // shape, but that's not easy to do. :-)
                QGraphicsSceneDragDropEvent dragLeave(QEvent::GraphicsSceneDragLeave);
                d->cloneDragDropEvent(&dragLeave, event);
                d->sendDragDropEvent(d->dragDropItem, &dragLeave);
            }

            // We've got a new drag & drop item
            d->dragDropItem = item;
        }

        // Send the move event.
        event->setDropAction(d->lastDropAction);
        event->accept();
        d->sendDragDropEvent(item, event);
        if (event->isAccepted())
            d->lastDropAction = event->dropAction();
        eventDelivered = true;
        break;
    }

    if (!eventDelivered) {
        if (d->dragDropItem) {
            // Leave the last drag drop item
            QGraphicsSceneDragDropEvent dragLeave(QEvent::GraphicsSceneDragLeave);
            d->cloneDragDropEvent(&dragLeave, event);
            d->sendDragDropEvent(d->dragDropItem, &dragLeave);
            d->dragDropItem = nullptr;
        }
        // Propagate
        event->setDropAction(Qt::IgnoreAction);
    }
}